

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-attack.c
# Opt level: O1

errr finish_parse_unarmed_blow(parser *p)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  unarmed_blow *puVar4;
  void *pvVar5;
  undefined8 *p_00;
  long lVar6;
  long lVar7;
  
  pvVar5 = parser_priv(p);
  num_unarmed_blows = L'\0';
  for (; pvVar5 != (void *)0x0; pvVar5 = *(void **)((long)pvVar5 + 0x10)) {
    num_unarmed_blows = num_unarmed_blows + L'\x01';
  }
  unarmed_blows = (unarmed_blow *)mem_zalloc((ulong)(uint)num_unarmed_blows * 0x18);
  p_00 = (undefined8 *)parser_priv(p);
  lVar6 = (long)num_unarmed_blows;
  if (0 < lVar6) {
    lVar7 = lVar6 + 1;
    lVar6 = lVar6 * 0x18;
    do {
      puVar4 = unarmed_blows;
      puVar2 = (undefined8 *)p_00[2];
      *(undefined8 **)((long)&unarmed_blows[-1].next + lVar6) = puVar2;
      uVar3 = p_00[1];
      puVar1 = (undefined8 *)((long)&puVar4[-1].name + lVar6);
      *puVar1 = *p_00;
      puVar1[1] = uVar3;
      mem_free(p_00);
      lVar7 = lVar7 + -1;
      p_00 = puVar2;
      lVar6 = lVar6 + -0x18;
    } while (1 < lVar7);
  }
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_unarmed_blow(struct parser *p) {
	struct unarmed_blow *blow = parser_priv(p), *next;
	int i;

	/* Count the blows */
	num_unarmed_blows = 0;
	while (blow) {
		blow = blow->next;
		num_unarmed_blows++;
	}

	/* Allocate the array */
	unarmed_blows = mem_zalloc(num_unarmed_blows * sizeof(struct unarmed_blow));
	blow = parser_priv(p);
	for (i = num_unarmed_blows - 1; i >= 0; i--) {
		next = blow->next;
		memcpy(&unarmed_blows[i], blow, sizeof(*blow));
		mem_free(blow);
		blow = next;
	}

	parser_destroy(p);
	return 0;
}